

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O0

Label __thiscall
asmjit::v1_14::BaseBuilder::newNamedLabel
          (BaseBuilder *this,char *name,size_t nameSize,LabelType type,uint32_t parentId)

{
  Error EVar1;
  long in_RSI;
  undefined4 *in_RDI;
  Label LVar2;
  LabelEntry *le;
  uint32_t labelId;
  undefined4 local_80;
  uint32_t in_stack_ffffffffffffff84;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 uVar3;
  undefined8 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  CodeHolder *in_stack_fffffffffffffff0;
  
  uVar3 = 0xffffffff;
  if (*(long *)(in_RSI + 0x30) != 0) {
    EVar1 = CodeHolder::newNamedLabelEntry
                      (in_stack_fffffffffffffff0,
                       (LabelEntry **)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                       (char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                       CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                       (LabelType)((ulong)in_stack_ffffffffffffffd0 >> 0x38),
                       (uint32_t)in_stack_ffffffffffffffd0);
    if (EVar1 == 0) {
      EVar1 = BaseBuilder_newLabelInternal
                        ((BaseBuilder *)CONCAT44(uVar3,in_stack_ffffffffffffff88),
                         in_stack_ffffffffffffff84);
      if (EVar1 == 0) {
        uVar3 = *(undefined4 *)(CONCAT44(in_stack_ffffffffffffff84,local_80) + 0xc);
      }
    }
  }
  *in_RDI = 5;
  in_RDI[1] = uVar3;
  in_RDI[2] = 0;
  in_RDI[3] = 0;
  LVar2.super_Operand.super_Operand_._data[0] = 0;
  LVar2.super_Operand.super_Operand_._data[1] = 0;
  LVar2.super_Operand.super_Operand_._0_8_ = in_RDI;
  return (Label)LVar2.super_Operand.super_Operand_;
}

Assistant:

Label BaseBuilder::newNamedLabel(const char* name, size_t nameSize, LabelType type, uint32_t parentId) {
  uint32_t labelId = Globals::kInvalidId;
  LabelEntry* le;

  if (_code &&
      _code->newNamedLabelEntry(&le, name, nameSize, type, parentId) == kErrorOk &&
      BaseBuilder_newLabelInternal(this, le->id()) == kErrorOk) {
    labelId = le->id();
  }

  return Label(labelId);
}